

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

bool absl::Mutex::DecrementSynchSem(Mutex *mu,PerThreadSynch *w,KernelTimeout t)

{
  bool bVar1;
  ThreadIdentity *pTVar2;
  
  pTVar2 = base_internal::CurrentThreadIdentityIfPresent();
  if (pTVar2 == (ThreadIdentity *)0x0) {
    pTVar2 = synchronization_internal::CreateThreadIdentity();
  }
  if (pTVar2 == (ThreadIdentity *)w) {
    bVar1 = AbslInternalPerThreadSemWait(t);
    return bVar1;
  }
  __assert_fail("w == Synch_GetPerThread()",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/synchronization/mutex.cc"
                ,0x241,
                "static bool absl::Mutex::DecrementSynchSem(Mutex *, PerThreadSynch *, KernelTimeout)"
               );
}

Assistant:

bool Mutex::DecrementSynchSem(Mutex *mu, PerThreadSynch *w, KernelTimeout t) {
  if (mu) {
    ABSL_TSAN_MUTEX_PRE_DIVERT(mu, 0);
  }
  assert(w == Synch_GetPerThread());
  static_cast<void>(w);
  bool res = PerThreadSem::Wait(t);
  if (mu) {
    ABSL_TSAN_MUTEX_POST_DIVERT(mu, 0);
  }
  return res;
}